

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O0

bool duckdb::ApproxQuantileCoding::Decode<double,int>(double *source,int *target)

{
  bool bVar1;
  int iVar2;
  int *in_RSI;
  double *in_RDI;
  undefined1 local_1;
  
  bVar1 = duckdb::TryCast::Operation<double,int>(*in_RDI,in_RSI,false);
  if (bVar1) {
    local_1 = true;
  }
  else {
    if (0.0 < *in_RDI || *in_RDI == 0.0) {
      iVar2 = NumericLimits<int>::Maximum();
      *in_RSI = iVar2;
    }
    else {
      iVar2 = NumericLimits<int>::Minimum();
      *in_RSI = iVar2;
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool Decode(const SAVE_TYPE &source, TARGET_TYPE &target) {
		// The result is approximate, so clamp instead of overflowing.
		if (TryCast::Operation(source, target, false)) {
			return true;
		} else if (source < 0) {
			target = NumericLimits<TARGET_TYPE>::Minimum();
		} else {
			target = NumericLimits<TARGET_TYPE>::Maximum();
		}
		return false;
	}